

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Type.cpp
# Opt level: O3

bool __thiscall phaeton::TensorDataType::operator==(TensorDataType *this,TensorDataType *RHS)

{
  pointer piVar1;
  pointer piVar2;
  int iVar3;
  ulong uVar4;
  ulong uVar5;
  long lVar6;
  ulong uVar7;
  long lVar8;
  long lVar9;
  long lVar10;
  bool bVar11;
  bool bVar12;
  
  piVar1 = (this->Dims).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  uVar5 = (long)(this->Dims).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_finish - (long)piVar1;
  uVar4 = uVar5 >> 2;
  piVar2 = (RHS->Dims).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
           ._M_start;
  uVar7 = (long)(RHS->Dims).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_finish - (long)piVar2;
  iVar3 = (int)uVar4;
  if (iVar3 == (int)(uVar7 >> 2)) {
    if (iVar3 == 0) {
      bVar11 = true;
    }
    else {
      lVar6 = (long)uVar5 >> 2;
      lVar8 = (long)uVar7 >> 2;
      lVar10 = 0;
      do {
        lVar9 = lVar6;
        if ((lVar6 == lVar10) || (lVar9 = lVar8, lVar8 == lVar10)) {
          std::__throw_out_of_range_fmt
                    ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",
                     lVar9,lVar9);
        }
        bVar11 = piVar1[lVar10] == piVar2[lVar10];
      } while ((bVar11) &&
              (bVar12 = (uVar4 & 0xffffffff) - 1 != lVar10, lVar10 = lVar10 + 1, bVar12));
    }
  }
  else {
    bVar11 = false;
  }
  return bVar11;
}

Assistant:

bool TensorDataType::operator==(const TensorDataType &RHS) const {
  if (getRank() != RHS.getRank()) {
    return false;
  }

  for (unsigned i = 0; i < getRank(); ++i) {
    if (getDim(i) != RHS.getDim(i)) {
      return false;
    }
  }

  return true;
}